

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O2

void __thiscall
helics::TimeDependencies::resetDependency(TimeDependencies *this,GlobalFederateId gid)

{
  __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  _Var1;
  long lVar2;
  DependencyInfo *pDVar3;
  byte bVar4;
  GlobalFederateId gid_local;
  DependencyInfo local_70;
  
  bVar4 = 0;
  pDVar3 = (this->dependencies).
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  _Var1 = std::
          lower_bound<__gnu_cxx::__normal_iterator<helics::DependencyInfo*,std::vector<helics::DependencyInfo,std::allocator<helics::DependencyInfo>>>,helics::GlobalFederateId,helics::__0>
                    ((this->dependencies).
                     super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start,pDVar3);
  if ((((_Var1._M_current != pDVar3) && (((_Var1._M_current)->fedID).gid == gid.gid)) &&
      (((_Var1._M_current)->super_TimeData).mTimeState == time_granted)) &&
     (((_Var1._M_current)->super_TimeData).lastGrant.internalTimeCode == 0x7fffffffffffffff)) {
    DependencyInfo::DependencyInfo(&local_70,gid);
    pDVar3 = &local_70;
    for (lVar2 = 0x54; lVar2 != 0; lVar2 = lVar2 + -1) {
      *(char *)&((_Var1._M_current)->super_TimeData).next.internalTimeCode =
           (char)(pDVar3->super_TimeData).next.internalTimeCode;
      pDVar3 = (DependencyInfo *)((long)pDVar3 + (ulong)bVar4 * -2 + 1);
      _Var1._M_current = _Var1._M_current + (ulong)bVar4 * -2 + 1;
    }
  }
  return;
}

Assistant:

void TimeDependencies::resetDependency(GlobalFederateId gid)
{
    auto dep = std::lower_bound(dependencies.begin(), dependencies.end(), gid, dependencyCompare);
    if (dep != dependencies.end()) {
        if (dep->fedID == gid) {
            if (dep->mTimeState == TimeState::time_granted && dep->lastGrant >= cBigTime) {
                *dep = DependencyInfo(dep->fedID);
            }
        }
    }
}